

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O3

void mess_init(void)

{
  t_printhook pdinstance;
  long lVar1;
  _instancestuff *p_Var2;
  t_symbol *ptVar3;
  _pdinstance *pdinstance_00;
  _pdinstance *pdinstance_01;
  _pdinstance *pdinstance_02;
  _pdinstance *pdinstance_03;
  _pdinstance *pdinstance_04;
  _pdinstance *pdinstance_05;
  _pdinstance *pdinstance_06;
  _pdinstance *pdinstance_07;
  _pdinstance *pdinstance_08;
  _pdinstance *pdinstance_09;
  _pdinstance *pdinstance_10;
  _pdinstance *pdinstance_11;
  _pdinstance *pdinstance_12;
  
  if (pd_objectmaker != (t_pd)0x0) {
    return;
  }
  s_inter_newpdinstance();
  sys_lock();
  pd_globallock();
  pd_maininstance.pd_canvaslist = (_glist *)0x0;
  pd_maininstance.pd_templatelist = (_template *)0x0;
  pd_maininstance.pd_systime = 0.0;
  pd_maininstance.pd_clock_setlist = (_clock *)0x0;
  pd_maininstance.pd_symhash = (t_symbol **)getbytes(0x20000);
  lVar1 = 0;
  do {
    pd_maininstance.pd_symhash[lVar1] = (t_symbol *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x4000);
  dogensym("pointer",&s_pointer,pdinstance_00);
  dogensym("float",&s_float,pdinstance_01);
  dogensym("symbol",&s_symbol,pdinstance_02);
  dogensym("bang",&s_bang,pdinstance_03);
  dogensym("list",&s_list,pdinstance_04);
  dogensym("anything",&s_anything,pdinstance_05);
  dogensym("signal",&s_signal,pdinstance_06);
  dogensym("#N",&s__N,pdinstance_07);
  dogensym("#X",&s__X,pdinstance_08);
  dogensym("x",&s_x,pdinstance_09);
  dogensym("y",&s_y,pdinstance_10);
  dogensym("",&s_,pdinstance_11);
  x_midi_newpdinstance();
  g_canvas_newpdinstance();
  d_ugen_newpdinstance();
  p_Var2 = (_instancestuff *)getbytes(0x68);
  pd_maininstance.pd_stuff = p_Var2;
  p_Var2->st_externlist = (t_namelist *)0x0;
  p_Var2->st_searchpath = (t_namelist *)0x0;
  p_Var2->st_staticpath = (t_namelist *)0x0;
  p_Var2->st_helppath = (t_namelist *)0x0;
  p_Var2->st_temppath = (t_namelist *)0x0;
  p_Var2->st_schedblocksize = 0x40;
  p_Var2->st_blocksize = 0x40;
  p_Var2->st_dacsr = 48000.0;
  pdinstance = sys_printhook;
  p_Var2->st_printhook = sys_printhook;
  p_Var2->st_impdata = (void *)0x0;
  class_extern_dir = &s_;
  ptVar3 = dogensym("objectmaker",(t_symbol *)0x0,(_pdinstance *)pdinstance);
  pd_objectmaker = class_new(ptVar3,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  ptVar3 = dogensym("canvasmaker",(t_symbol *)0x0,pdinstance_12);
  pd_canvasmaker = class_new(ptVar3,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  if (pd_objectmaker != (t_pd)0x0) {
    pd_objectmaker->c_anymethod = new_anything;
  }
  pd_globalunlock();
  sys_unlock();
  return;
}

Assistant:

void mess_init(void)
{
    if (pd_objectmaker)
        return;
#ifdef PDINSTANCE
    pd_this = &pd_maininstance;
#endif
    s_inter_newpdinstance();
    sys_lock();
    pd_globallock();
    pdinstance_init(&pd_maininstance);
    class_extern_dir = &s_;
    pd_objectmaker = class_new(gensym("objectmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    pd_canvasmaker = class_new(gensym("canvasmaker"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    class_addanything(pd_objectmaker, (t_method)new_anything);
    pd_globalunlock();
    sys_unlock();
}